

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseExternalID(xmlParserCtxtPtr ctxt,xmlChar **publicID,int strict)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  int iVar3;
  char *pcVar4;
  xmlChar *pxVar5;
  
  *publicID = (xmlChar *)0x0;
  pxVar2 = ctxt->input;
  pxVar5 = pxVar2->cur;
  if (*pxVar5 == 'P') {
    if ((((pxVar5[1] != 'U') || (pxVar5[2] != 'B')) || (pxVar5[3] != 'L')) ||
       ((pxVar5[4] != 'I' || (pxVar5[5] != 'C')))) {
      return (xmlChar *)0x0;
    }
    pxVar2->cur = pxVar5 + 6;
    pxVar2->col = pxVar2->col + 6;
    if (pxVar5[6] == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 == 0) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Space required after \'PUBLIC\'\n");
    }
    pxVar5 = xmlParsePubidLiteral(ctxt);
    *publicID = pxVar5;
    if (pxVar5 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_PUBID_REQUIRED,(char *)0x0);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (strict == 0) {
      if (iVar3 == 0) {
        return (xmlChar *)0x0;
      }
      xVar1 = *ctxt->input->cur;
      if ((xVar1 != '\'') && (xVar1 != '\"')) {
        return (xmlChar *)0x0;
      }
      goto LAB_0013380a;
    }
    if (iVar3 != 0) goto LAB_0013380a;
    pcVar4 = "Space required after the Public Identifier\n";
  }
  else {
    if (*pxVar5 != 'S') {
      return (xmlChar *)0x0;
    }
    if (pxVar5[1] != 'Y') {
      return (xmlChar *)0x0;
    }
    if (pxVar5[2] != 'S') {
      return (xmlChar *)0x0;
    }
    if (pxVar5[3] != 'T') {
      return (xmlChar *)0x0;
    }
    if (pxVar5[4] != 'E') {
      return (xmlChar *)0x0;
    }
    if (pxVar5[5] != 'M') {
      return (xmlChar *)0x0;
    }
    pxVar2->cur = pxVar5 + 6;
    pxVar2->col = pxVar2->col + 6;
    if (pxVar5[6] == '\0') {
      xmlParserGrow(ctxt);
    }
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 != 0) goto LAB_0013380a;
    pcVar4 = "Space required after \'SYSTEM\'\n";
  }
  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
             (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar4);
LAB_0013380a:
  pxVar5 = xmlParseSystemLiteral(ctxt);
  if (pxVar5 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_URI_REQUIRED,(char *)0x0);
    return (xmlChar *)0x0;
  }
  return pxVar5;
}

Assistant:

xmlChar *
xmlParseExternalID(xmlParserCtxtPtr ctxt, xmlChar **publicID, int strict) {
    xmlChar *URI = NULL;

    *publicID = NULL;
    if (CMP6(CUR_PTR, 'S', 'Y', 'S', 'T', 'E', 'M')) {
        SKIP(6);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
	                   "Space required after 'SYSTEM'\n");
	}
	URI = xmlParseSystemLiteral(ctxt);
	if (URI == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_URI_REQUIRED, NULL);
        }
    } else if (CMP6(CUR_PTR, 'P', 'U', 'B', 'L', 'I', 'C')) {
        SKIP(6);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		    "Space required after 'PUBLIC'\n");
	}
	*publicID = xmlParsePubidLiteral(ctxt);
	if (*publicID == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_PUBID_REQUIRED, NULL);
	}
	if (strict) {
	    /*
	     * We don't handle [83] so "S SystemLiteral" is required.
	     */
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the Public Identifier\n");
	    }
	} else {
	    /*
	     * We handle [83] so we return immediately, if
	     * "S SystemLiteral" is not detected. We skip blanks if no
             * system literal was found, but this is harmless since we must
             * be at the end of a NotationDecl.
	     */
	    if (SKIP_BLANKS == 0) return(NULL);
	    if ((CUR != '\'') && (CUR != '"')) return(NULL);
	}
	URI = xmlParseSystemLiteral(ctxt);
	if (URI == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_URI_REQUIRED, NULL);
        }
    }
    return(URI);
}